

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O3

int keysymToQtKey_internal
              (xkb_keysym_t keysym,KeyboardModifiers modifiers,xkb_state *state,xkb_keycode_t code,
              bool superAsMeta,bool hyperAsMeta)

{
  char16_t cVar1;
  Data *pDVar2;
  qsizetype qVar3;
  QArrayData *pQVar4;
  uint uVar5;
  int iVar6;
  ArrayType<_1dece4ca_> *pAVar7;
  char16_t *pcVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  wchar32 wVar13;
  long in_FS_OFFSET;
  xkb_keysym_t upper;
  xkb_keysym_t lower;
  QString local_58;
  QArrayData *local_38;
  char16_t *pcStack_30;
  ulong local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (keysym - 0xffbe < 0x23) {
    uVar9 = keysym + 0xff0072;
  }
  else if (keysym - 0xffb0 < 10) {
    uVar9 = keysym - 0xff80;
  }
  else if (keysym - 0x20 < 0xe0) {
    local_38 = (QArrayData *)CONCAT44(local_38._4_4_,0xaaaaaaaa);
    local_58.d.d = (Data *)CONCAT44(local_58.d.d._4_4_,0xaaaaaaaa);
    QXkbCommon::xkbcommon_XConvertCase(keysym,(xkb_keysym_t *)&local_38,(xkb_keysym_t *)&local_58);
    uVar9 = keysym;
    if ((uint)local_58.d.d - 0x20 < 0xe0) {
      uVar9 = (uint)local_58.d.d;
    }
  }
  else {
    uVar10 = 0x131;
    pAVar7 = &KeyTbl;
    do {
      uVar11 = uVar10 >> 1;
      uVar12 = ~uVar11 + uVar10;
      uVar10 = uVar11;
      if (((xkb2qt *)((long)pAVar7 + uVar11 * 8))->xkb < keysym) {
        pAVar7 = (ArrayType<_1dece4ca_> *)((xkb2qt *)((long)pAVar7 + uVar11 * 8) + 1);
        uVar10 = uVar12;
      }
    } while (0 < (long)uVar10);
    uVar9 = 0;
    if ((pAVar7 != (ArrayType<_1dece4ca_> *)&DAT_006ce0e8) &&
       (uVar9 = 0, ((xkb2qt *)&pAVar7->_M_elems[0].xkb)->xkb <= keysym)) {
      uVar9 = ((xkb2qt *)&pAVar7->_M_elems[0].qt)->xkb;
    }
    uVar5 = uVar9;
    if (uVar9 + 0xfeffffad < 2) {
      uVar5 = 0x1000022;
    }
    if (!superAsMeta) {
      uVar5 = uVar9;
    }
    uVar9 = 0x1000022;
    if ((uVar5 & 0xfffffffe) != 0x1000056) {
      uVar9 = uVar5;
    }
    if (!hyperAsMeta) {
      uVar9 = uVar5;
    }
    if (uVar9 == 0) {
      local_38 = (QArrayData *)0x0;
      pcStack_30 = (char16_t *)0x0;
      local_28 = 0;
      if (state == (xkb_state *)0x0 ||
          ((uint)modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                 super_QFlagsStorage<Qt::KeyboardModifier>.i >> 0x1a & 1) != 0) {
        QXkbCommon::lookupStringNoKeysymTransformations(&local_58,keysym);
      }
      else {
        QXkbCommon::lookupString(&local_58,state,code);
      }
      local_38 = &(local_58.d.d)->super_QArrayData;
      pcStack_30 = local_58.d.ptr;
      local_28 = local_58.d.size;
      uVar5 = 0;
      uVar9 = 0;
      if (local_58.d.size != 0) {
        pcVar8 = local_58.d.ptr;
        if (local_58.d.ptr == (char16_t *)0x0) {
          pcVar8 = (char16_t *)&QString::_empty;
        }
        wVar13 = (wchar32)(ushort)*pcVar8;
        if (((ushort)*pcVar8 - 0x30 < 10) ||
           ((0x7f < (uint)wVar13 && (iVar6 = QChar::category(wVar13), iVar6 == 3)))) {
          iVar6 = QChar::digitValue(wVar13);
          uVar9 = iVar6 + 0x30;
        }
        else {
          QString::toUpper_helper((QString *)&local_58);
          pcVar8 = pcStack_30;
          pQVar4 = local_38;
          qVar3 = local_58.d.size;
          pDVar2 = local_58.d.d;
          local_58.d.d = (Data *)local_38;
          local_38 = &pDVar2->super_QArrayData;
          pcStack_30 = local_58.d.ptr;
          local_58.d.ptr = pcVar8;
          local_58.d.size = local_28;
          local_28 = qVar3;
          if (pQVar4 != (QArrayData *)0x0) {
            LOCK();
            (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar4,2,0x10);
            }
          }
          cVar1 = *pcStack_30;
          if ((cVar1 & 0xf800U) == 0xd800) {
            uVar9 = uVar5;
            if (((1 < local_28) && ((cVar1 & 0xdc00U) == 0xd800)) &&
               ((pcStack_30[1] & 0xfc00U) == 0xdc00)) {
              uVar9 = (uint)(ushort)cVar1 * 0x400 + (uint)(ushort)pcStack_30[1] + 0xfca02400;
            }
          }
          else {
            uVar9 = (uint)(ushort)cVar1;
          }
        }
      }
      if (local_38 != (QArrayData *)0x0) {
        LOCK();
        (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_38,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return uVar9;
  }
  __stack_chk_fail();
}

Assistant:

static int keysymToQtKey_internal(xkb_keysym_t keysym, Qt::KeyboardModifiers modifiers,
                                  xkb_state *state, xkb_keycode_t code,
                                  bool superAsMeta, bool hyperAsMeta)
{
    int qtKey = 0;

    // lookup from direct mapping
    if (keysym >= XKB_KEY_F1 && keysym <= XKB_KEY_F35) {
        // function keys
        qtKey = Qt::Key_F1 + (keysym - XKB_KEY_F1);
    } else if (keysym >= XKB_KEY_KP_0 && keysym <= XKB_KEY_KP_9) {
        // numeric keypad keys
        qtKey = Qt::Key_0 + (keysym - XKB_KEY_KP_0);
    } else if (QXkbCommon::isLatin1(keysym)) {
        // Most Qt::Key values are determined by their upper-case version,
        // where this is in the Latin-1 repertoire. So start with that:
        qtKey = QXkbCommon::qxkbcommon_xkb_keysym_to_upper(keysym);
        // However, Key_mu and Key_ydiaeresis are U+00B5 MICRO SIGN and
        // U+00FF LATIN SMALL LETTER Y WITH DIAERESIS, both lower-case,
        // with upper-case forms outside Latin-1, so use them as they are
        // since they're the Qt::Key values.
        if (!QXkbCommon::isLatin1(qtKey))
            qtKey = keysym;
    } else {
        // check if we have a direct mapping
        xkb2qt_t searchKey{keysym, 0};
        auto it = std::lower_bound(KeyTbl.cbegin(), KeyTbl.cend(), searchKey);
        if (it != KeyTbl.end() && !(searchKey < *it))
            qtKey = it->qt;

        // translate Super/Hyper keys to Meta if we're using them as the MetaModifier
        if (superAsMeta && (qtKey == Qt::Key_Super_L || qtKey == Qt::Key_Super_R))
            qtKey = Qt::Key_Meta;
        if (hyperAsMeta && (qtKey == Qt::Key_Hyper_L || qtKey == Qt::Key_Hyper_R))
            qtKey = Qt::Key_Meta;
    }

    if (qtKey)
        return qtKey;

    // lookup from unicode
    QString text;
    if (!state || modifiers & Qt::ControlModifier) {
        // Control modifier changes the text to ASCII control character, therefore we
        // can't use this text to map keysym to a qt key. We can use the same keysym
        // (it is not affectd by transformation) to obtain untransformed text. For details
        // see "Appendix A. Default Symbol Transformations" in the XKB specification.
        text = QXkbCommon::lookupStringNoKeysymTransformations(keysym);
    } else {
        text = QXkbCommon::lookupString(state, code);
    }
    if (!text.isEmpty()) {
         if (text.unicode()->isDigit()) {
             // Ensures that also non-latin digits are mapped to corresponding qt keys,
             // e.g CTRL + ۲ (arabic two), is mapped to CTRL + Qt::Key_2.
             qtKey = Qt::Key_0 + text.unicode()->digitValue();
         } else {
             text = text.toUpper();
             QStringIterator i(text);
             qtKey = i.next(0);
         }
    }

    return qtKey;
}